

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

shared_ptr<wallet::CWallet> __thiscall
wallet::TestLoadWallet
          (wallet *this,
          unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> database,
          WalletContext *context,uint64_t create_flags)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_FS_OFFSET;
  shared_ptr<wallet::CWallet> sVar1;
  vector<bilingual_str,_std::allocator<bilingual_str>_> warnings;
  bilingual_str error;
  long *local_b8;
  allocator<char> local_a9;
  vector<bilingual_str,_std::allocator<bilingual_str>_> local_a8;
  string local_88;
  bilingual_str local_68;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_68.original._M_dataplus._M_p = (pointer)&local_68.original.field_2;
  local_68.original._M_string_length = 0;
  local_68.original.field_2._M_local_buf[0] = '\0';
  local_68.translated._M_dataplus._M_p = (pointer)&local_68.translated.field_2;
  local_68.translated._M_string_length = 0;
  local_68.translated.field_2._M_local_buf[0] = '\0';
  local_a8.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"",&local_a9);
  local_b8 = *(long **)database._M_t.
                       super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
                       .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl;
  *(undefined8 *)
   database._M_t.
   super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>._M_t.
   super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>.
   super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl = 0;
  CWallet::Create((CWallet *)this,context,&local_88,
                  (unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>)
                  &local_b8,create_flags,&local_68,&local_a8);
  if (local_b8 != (long *)0x0) {
    (**(code **)(*local_b8 + 8))();
  }
  local_b8 = (long *)0x0;
  std::__cxx11::string::~string((string *)&local_88);
  NotifyWalletLoaded(context,(shared_ptr<wallet::CWallet> *)this);
  if (context->chain != (Chain *)0x0) {
    CWallet::postInitProcess(*(CWallet **)this);
  }
  std::vector<bilingual_str,_std::allocator<bilingual_str>_>::~vector(&local_a8);
  bilingual_str::~bilingual_str(&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    sVar1.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    sVar1.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<wallet::CWallet>)
           sVar1.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>;
  }
  __stack_chk_fail();
}

Assistant:

std::shared_ptr<CWallet> TestLoadWallet(std::unique_ptr<WalletDatabase> database, WalletContext& context, uint64_t create_flags)
{
    bilingual_str error;
    std::vector<bilingual_str> warnings;
    auto wallet = CWallet::Create(context, "", std::move(database), create_flags, error, warnings);
    NotifyWalletLoaded(context, wallet);
    if (context.chain) {
        wallet->postInitProcess();
    }
    return wallet;
}